

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

int __thiscall cmCTestBuildHandler::ProcessHandler(cmCTestBuildHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  reference pbVar6;
  long lVar7;
  char *dir;
  pointer pcVar8;
  double dVar9;
  double dVar10;
  string local_2a10 [32];
  undefined1 local_29f0 [8];
  ostringstream cmCTestLog_msg_17;
  string local_2878 [32];
  undefined1 local_2858 [8];
  ostringstream cmCTestLog_msg_16;
  string local_26e0 [32];
  undefined1 local_26c0 [8];
  ostringstream cmCTestLog_msg_15;
  undefined1 local_2548 [8];
  cmXMLWriter xml;
  undefined1 local_24f8 [8];
  ostringstream cmCTestLog_msg_14;
  undefined1 local_2380 [8];
  cmGeneratedFileStream xofs;
  __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
  local_2128;
  cmCTestBuildErrorWarning *local_2120;
  __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
  local_2118;
  iterator evit;
  double elapsed_build_time;
  string local_20e8 [32];
  undefined1 local_20c8 [8];
  ostringstream cmCTestLog_msg_13;
  int local_1f50;
  int local_1f4c;
  int res;
  int retVal;
  string local_1f28 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f08;
  undefined1 local_1ee8 [8];
  string bindirrep;
  string local_1ec0;
  string local_1ea0;
  undefined1 local_1e80 [8];
  string bindir;
  string local_1e58;
  string local_1e38;
  string local_1e18 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1df8;
  undefined1 local_1dd8 [8];
  string srcdirrep;
  string local_1db0;
  string local_1d90;
  undefined1 local_1d70 [8];
  string srcdir;
  string local_1d48;
  string local_1d28;
  RegularExpression local_1d08;
  string local_1c38 [32];
  undefined1 local_1c18 [8];
  ostringstream cmCTestLog_msg_12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a98;
  string local_1a90 [32];
  ostringstream local_1a70 [8];
  ostringstream cmCTestLog_msg_11;
  RegularExpression local_18f8;
  string local_1828 [32];
  undefined1 local_1808 [8];
  ostringstream cmCTestLog_msg_10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1688;
  string local_1680 [32];
  ostringstream local_1660 [8];
  ostringstream cmCTestLog_msg_9;
  RegularExpression local_14e8;
  string local_1418 [32];
  undefined1 local_13f8 [8];
  ostringstream cmCTestLog_msg_8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1278;
  string local_1270 [32];
  ostringstream local_1250 [8];
  ostringstream cmCTestLog_msg_7;
  RegularExpression local_10d8;
  string local_1008 [32];
  undefined1 local_fe8 [8];
  ostringstream cmCTestLog_msg_6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e68;
  string local_e60 [32];
  ostringstream local_e40 [8];
  ostringstream cmCTestLog_msg_5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_cc8;
  iterator it;
  value_type local_cb8;
  allocator local_c91;
  value_type local_c90;
  allocator local_c69;
  value_type local_c68;
  allocator local_c41;
  value_type local_c40;
  long local_c20;
  size_type cc;
  undefined1 local_bf8 [8];
  ostringstream cmCTestLog_msg_4;
  double elapsed_time_start;
  cmGeneratedFileStream ofs;
  string local_828;
  string local_808;
  string *local_7e8;
  string *useLaunchers;
  undefined1 local_7c0 [8];
  ostringstream cmCTestLog_msg_3;
  allocator local_641;
  string local_640;
  string local_620;
  string *local_600;
  string *buildDirectory;
  string local_5f0 [32];
  undefined1 local_5d0 [8];
  ostringstream cmCTestLog_msg_2;
  undefined1 local_458 [8];
  string makeCommand;
  undefined1 local_418 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_2a0 [8];
  cmCTestCompileErrorWarningRex r;
  string local_1c0 [4];
  int entry;
  ostringstream local_190 [8];
  ostringstream cmCTestLog_msg;
  cmCTestBuildHandler *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar3 = std::operator<<((ostream *)local_190,"Build project");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x13c,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  dVar9 = cmCTest::GetRemainingTimeAllowed((this->super_cmCTestGenericHandler).CTest);
  if (120.0 <= dVar9) {
    r.RegularExpression.searchstring._4_4_ = 0;
    while (cmCTestWarningErrorFileLine[r.RegularExpression.searchstring._4_4_].
           RegularExpressionString != (char *)0x0) {
      cmCTestCompileErrorWarningRex::cmCTestCompileErrorWarningRex
                ((cmCTestCompileErrorWarningRex *)local_2a0);
      bVar2 = cmsys::RegularExpression::compile
                        ((RegularExpression *)&r,
                         cmCTestWarningErrorFileLine[r.RegularExpression.searchstring._4_4_].
                         RegularExpressionString);
      if (bVar2) {
        local_2a0._0_4_ =
             cmCTestWarningErrorFileLine[r.RegularExpression.searchstring._4_4_].FileIndex;
        local_2a0._4_4_ =
             cmCTestWarningErrorFileLine[r.RegularExpression.searchstring._4_4_].LineIndex;
        std::
        vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
        ::push_back(&this->ErrorWarningFileLineRegex,(value_type *)local_2a0);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
        poVar3 = std::operator<<((ostream *)local_418,"Problem Compiling regular expression: ");
        poVar3 = std::operator<<(poVar3,cmCTestWarningErrorFileLine
                                        [r.RegularExpression.searchstring._4_4_].
                                        RegularExpressionString);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x156,pcVar4,false);
        std::__cxx11::string::~string((string *)(makeCommand.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
      }
      cmCTestCompileErrorWarningRex::~cmCTestCompileErrorWarningRex
                ((cmCTestCompileErrorWarningRex *)local_2a0);
      r.RegularExpression.searchstring._4_4_ = r.RegularExpression.searchstring._4_4_ + 1;
    }
    GetMakeCommand_abi_cxx11_((string *)local_458,this);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_640,"BuildDirectory",&local_641);
      cmCTest::GetCTestConfiguration(&local_620,pcVar1,&local_640);
      std::__cxx11::string::~string((string *)&local_640);
      std::allocator<char>::~allocator((allocator<char> *)&local_641);
      local_600 = &local_620;
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_828,"UseLaunchers",(allocator *)&ofs.field_0x247);
        cmCTest::GetCTestConfiguration(&local_808,pcVar1,&local_828);
        std::__cxx11::string::~string((string *)&local_828);
        std::allocator<char>::~allocator((allocator<char> *)&ofs.field_0x247);
        local_7e8 = &local_808;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        bVar2 = cmSystemTools::IsOn(pcVar4);
        this->UseCTestLaunch = bVar2;
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&elapsed_time_start);
        dVar9 = cmsys::SystemTools::GetTime();
        bVar2 = cmCTestGenericHandler::StartLogFile
                          (&this->super_cmCTestGenericHandler,"Build",
                           (cmGeneratedFileStream *)&elapsed_time_start);
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_bf8);
          poVar3 = std::operator<<((ostream *)local_bf8,"Cannot create build log file");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x178,pcVar4,false);
          std::__cxx11::string::~string((string *)&cc);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_bf8);
        }
        for (local_c20 = 0; cmCTestErrorMatches[local_c20] != (char *)0x0; local_c20 = local_c20 + 1
            ) {
          pcVar4 = cmCTestErrorMatches[local_c20];
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_c40,pcVar4,&local_c41);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->CustomErrorMatches,&local_c40);
          std::__cxx11::string::~string((string *)&local_c40);
          std::allocator<char>::~allocator((allocator<char> *)&local_c41);
        }
        for (local_c20 = 0; cmCTestErrorExceptions[local_c20] != (char *)0x0;
            local_c20 = local_c20 + 1) {
          pcVar4 = cmCTestErrorExceptions[local_c20];
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_c68,pcVar4,&local_c69);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->CustomErrorExceptions,&local_c68);
          std::__cxx11::string::~string((string *)&local_c68);
          std::allocator<char>::~allocator((allocator<char> *)&local_c69);
        }
        for (local_c20 = 0; cmCTestWarningMatches[local_c20] != (char *)0x0;
            local_c20 = local_c20 + 1) {
          pcVar4 = cmCTestWarningMatches[local_c20];
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_c90,pcVar4,&local_c91);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->CustomWarningMatches,&local_c90);
          std::__cxx11::string::~string((string *)&local_c90);
          std::allocator<char>::~allocator((allocator<char> *)&local_c91);
        }
        for (local_c20 = 0; cmCTestWarningExceptions[local_c20] != (char *)0x0;
            local_c20 = local_c20 + 1) {
          pcVar4 = cmCTestWarningExceptions[local_c20];
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_cb8,pcVar4,(allocator *)((long)&it._M_current + 7));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->CustomWarningExceptions,&local_cb8);
          std::__cxx11::string::~string((string *)&local_cb8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::__normal_iterator(&local_cc8);
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorMatchRegex);
        std::__cxx11::ostringstream::ostringstream(local_e40);
        poVar3 = (ostream *)std::ostream::operator<<(local_e40,this);
        poVar3 = std::operator<<(poVar3,"Add this->ErrorMatchRegex");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x19e,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_e60);
        std::__cxx11::ostringstream::~ostringstream(local_e40);
        local_e68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin(&this->CustomErrorMatches);
        local_cc8._M_current = local_e68;
        while( true ) {
          local_e70._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->CustomErrorMatches);
          bVar2 = __gnu_cxx::operator!=(&local_cc8,&local_e70);
          if (!bVar2) break;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_fe8);
          poVar3 = std::operator<<((ostream *)local_fe8,"Add this->CustomErrorMatches: ");
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_cc8);
          poVar3 = std::operator<<(poVar3,(string *)pbVar6);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x19e,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1008);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_fe8);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_cc8);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmsys::RegularExpression::RegularExpression(&local_10d8,pcVar4);
          std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
          push_back(&this->ErrorMatchRegex,&local_10d8);
          cmsys::RegularExpression::~RegularExpression(&local_10d8);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_cc8);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorExceptionRegex);
        std::__cxx11::ostringstream::ostringstream(local_1250);
        poVar3 = (ostream *)std::ostream::operator<<(local_1250,this);
        poVar3 = std::operator<<(poVar3,"Add this->ErrorExceptionRegex");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x1a0,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_1270);
        std::__cxx11::ostringstream::~ostringstream(local_1250);
        local_1278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(&this->CustomErrorExceptions);
        local_cc8._M_current = local_1278;
        while( true ) {
          local_1280._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->CustomErrorExceptions);
          bVar2 = __gnu_cxx::operator!=(&local_cc8,&local_1280);
          if (!bVar2) break;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13f8);
          poVar3 = std::operator<<((ostream *)local_13f8,"Add this->CustomErrorExceptions: ");
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_cc8);
          poVar3 = std::operator<<(poVar3,(string *)pbVar6);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1a0,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1418);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13f8);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_cc8);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmsys::RegularExpression::RegularExpression(&local_14e8,pcVar4);
          std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
          push_back(&this->ErrorExceptionRegex,&local_14e8);
          cmsys::RegularExpression::~RegularExpression(&local_14e8);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_cc8);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningMatchRegex);
        std::__cxx11::ostringstream::ostringstream(local_1660);
        poVar3 = (ostream *)std::ostream::operator<<(local_1660,this);
        poVar3 = std::operator<<(poVar3,"Add this->WarningMatchRegex");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x1a2,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_1680);
        std::__cxx11::ostringstream::~ostringstream(local_1660);
        local_1688 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(&this->CustomWarningMatches);
        local_cc8._M_current = local_1688;
        while( true ) {
          local_1690._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->CustomWarningMatches);
          bVar2 = __gnu_cxx::operator!=(&local_cc8,&local_1690);
          if (!bVar2) break;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1808);
          poVar3 = std::operator<<((ostream *)local_1808,"Add this->CustomWarningMatches: ");
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_cc8);
          poVar3 = std::operator<<(poVar3,(string *)pbVar6);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1a2,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1828);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1808);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_cc8);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmsys::RegularExpression::RegularExpression(&local_18f8,pcVar4);
          std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
          push_back(&this->WarningMatchRegex,&local_18f8);
          cmsys::RegularExpression::~RegularExpression(&local_18f8);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_cc8);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningExceptionRegex);
        std::__cxx11::ostringstream::ostringstream(local_1a70);
        poVar3 = (ostream *)std::ostream::operator<<(local_1a70,this);
        poVar3 = std::operator<<(poVar3,"Add this->WarningExceptionRegex");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x1a4,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_1a90);
        std::__cxx11::ostringstream::~ostringstream(local_1a70);
        local_1a98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(&this->CustomWarningExceptions);
        local_cc8._M_current = local_1a98;
        while( true ) {
          local_1aa0._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->CustomWarningExceptions);
          bVar2 = __gnu_cxx::operator!=(&local_cc8,&local_1aa0);
          if (!bVar2) break;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c18);
          poVar3 = std::operator<<((ostream *)local_1c18,"Add this->CustomWarningExceptions: ");
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_cc8);
          poVar3 = std::operator<<(poVar3,(string *)pbVar6);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1a4,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1c38);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c18);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_cc8);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmsys::RegularExpression::RegularExpression(&local_1d08,pcVar4);
          std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
          push_back(&this->WarningExceptionRegex,&local_1d08);
          cmsys::RegularExpression::~RegularExpression(&local_1d08);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_cc8);
        }
        std::__cxx11::string::operator=((string *)&this->SimplifySourceDir,"");
        std::__cxx11::string::operator=((string *)&this->SimplifyBuildDir,"");
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1d48,"SourceDirectory",
                   (allocator *)(srcdir.field_2._M_local_buf + 0xf));
        cmCTest::GetCTestConfiguration(&local_1d28,pcVar1,&local_1d48);
        uVar5 = std::__cxx11::string::size();
        std::__cxx11::string::~string((string *)&local_1d28);
        std::__cxx11::string::~string((string *)&local_1d48);
        std::allocator<char>::~allocator((allocator<char> *)(srcdir.field_2._M_local_buf + 0xf));
        if (0x14 < uVar5) {
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1db0,"SourceDirectory",
                     (allocator *)(srcdirrep.field_2._M_local_buf + 0xf));
          cmCTest::GetCTestConfiguration(&local_1d90,pcVar1,&local_1db0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d70,&local_1d90,"/");
          std::__cxx11::string::~string((string *)&local_1d90);
          std::__cxx11::string::~string((string *)&local_1db0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(srcdirrep.field_2._M_local_buf + 0xf));
          std::__cxx11::string::string((string *)local_1dd8);
          local_c20 = std::__cxx11::string::size();
          for (local_c20 = local_c20 + -2; local_c20 != 0; local_c20 = local_c20 + -1) {
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_1d70);
            if (*pcVar4 == '/') {
              lVar7 = std::__cxx11::string::c_str();
              std::__cxx11::string::operator=((string *)local_1dd8,(char *)(lVar7 + local_c20));
              std::operator+(&local_1df8,"/...",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1dd8);
              std::__cxx11::string::operator=((string *)local_1dd8,(string *)&local_1df8);
              std::__cxx11::string::~string((string *)&local_1df8);
              std::__cxx11::string::substr((ulong)local_1e18,(ulong)local_1d70);
              std::__cxx11::string::operator=((string *)local_1d70,local_1e18);
              std::__cxx11::string::~string(local_1e18);
              break;
            }
          }
          std::__cxx11::string::operator=((string *)&this->SimplifySourceDir,(string *)local_1d70);
          std::__cxx11::string::~string((string *)local_1dd8);
          std::__cxx11::string::~string((string *)local_1d70);
        }
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1e58,"BuildDirectory",
                   (allocator *)(bindir.field_2._M_local_buf + 0xf));
        cmCTest::GetCTestConfiguration(&local_1e38,pcVar1,&local_1e58);
        uVar5 = std::__cxx11::string::size();
        std::__cxx11::string::~string((string *)&local_1e38);
        std::__cxx11::string::~string((string *)&local_1e58);
        std::allocator<char>::~allocator((allocator<char> *)(bindir.field_2._M_local_buf + 0xf));
        if (0x14 < uVar5) {
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1ec0,"BuildDirectory",
                     (allocator *)(bindirrep.field_2._M_local_buf + 0xf));
          cmCTest::GetCTestConfiguration(&local_1ea0,pcVar1,&local_1ec0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e80,&local_1ea0,"/");
          std::__cxx11::string::~string((string *)&local_1ea0);
          std::__cxx11::string::~string((string *)&local_1ec0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(bindirrep.field_2._M_local_buf + 0xf));
          std::__cxx11::string::string((string *)local_1ee8);
          local_c20 = std::__cxx11::string::size();
          for (local_c20 = local_c20 + -2; local_c20 != 0; local_c20 = local_c20 + -1) {
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_1e80);
            if (*pcVar4 == '/') {
              lVar7 = std::__cxx11::string::c_str();
              std::__cxx11::string::operator=((string *)local_1ee8,(char *)(lVar7 + local_c20));
              std::operator+(&local_1f08,"/...",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1ee8);
              std::__cxx11::string::operator=((string *)local_1ee8,(string *)&local_1f08);
              std::__cxx11::string::~string((string *)&local_1f08);
              std::__cxx11::string::substr((ulong)local_1f28,(ulong)local_1e80);
              std::__cxx11::string::operator=((string *)local_1e80,local_1f28);
              std::__cxx11::string::~string(local_1f28);
              break;
            }
          }
          std::__cxx11::string::operator=((string *)&this->SimplifyBuildDir,(string *)local_1e80);
          std::__cxx11::string::~string((string *)local_1ee8);
          std::__cxx11::string::~string((string *)local_1e80);
        }
        cmCTest::CurrentTime_abi_cxx11_((string *)&res,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->StartBuild,(string *)&res);
        std::__cxx11::string::~string((string *)&res);
        dVar10 = cmsys::SystemTools::GetTime();
        this->StartBuildTime = dVar10;
        local_1f4c = 0;
        local_1f50 = 4;
        bVar2 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_20c8);
          poVar3 = std::operator<<((ostream *)local_20c8,"Build with command: ");
          poVar3 = std::operator<<(poVar3,(string *)local_458);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1dd,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_20e8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_20c8);
        }
        else {
          pcVar4 = (char *)std::__cxx11::string::c_str();
          dir = (char *)std::__cxx11::string::c_str();
          local_1f50 = RunMakeCommand(this,pcVar4,&local_1f4c,dir,0,(ostream *)&elapsed_time_start);
        }
        cmCTest::CurrentTime_abi_cxx11_
                  ((string *)&elapsed_build_time,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->EndBuild,(string *)&elapsed_build_time);
        std::__cxx11::string::~string((string *)&elapsed_build_time);
        dVar10 = cmsys::SystemTools::GetTime();
        this->EndBuildTime = dVar10;
        dVar10 = cmsys::SystemTools::GetTime();
        evit._M_current = (cmCTestBuildErrorWarning *)(dVar10 - dVar9);
        __gnu_cxx::
        __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
        ::__normal_iterator(&local_2118);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          local_2120 = (cmCTestBuildErrorWarning *)
                       std::
                       vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                       ::begin(&this->ErrorsAndWarnings);
          local_2118._M_current = local_2120;
          while( true ) {
            local_2128._M_current =
                 (cmCTestBuildErrorWarning *)
                 std::
                 vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                 ::end(&this->ErrorsAndWarnings);
            bVar2 = __gnu_cxx::operator!=(&local_2118,&local_2128);
            if (!bVar2) break;
            pcVar8 = __gnu_cxx::
                     __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                     ::operator->(&local_2118);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(&pcVar8->Text,pcVar4,"/.../");
            pcVar8 = __gnu_cxx::
                     __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                     ::operator->(&local_2118);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(&pcVar8->PreContext,pcVar4,"/.../");
            pcVar8 = __gnu_cxx::
                     __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                     ::operator->(&local_2118);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(&pcVar8->PostContext,pcVar4,"/.../");
            __gnu_cxx::
            __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
            ::operator++(&local_2118);
          }
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          local_2118._M_current =
               (cmCTestBuildErrorWarning *)
               std::
               vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
               ::begin(&this->ErrorsAndWarnings);
          while( true ) {
            xofs._576_8_ = std::
                           vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                           ::end(&this->ErrorsAndWarnings);
            bVar2 = __gnu_cxx::operator!=
                              (&local_2118,
                               (__normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                                *)&xofs.field_0x240);
            if (!bVar2) break;
            pcVar8 = __gnu_cxx::
                     __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                     ::operator->(&local_2118);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(&pcVar8->Text,pcVar4,"/.../");
            pcVar8 = __gnu_cxx::
                     __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                     ::operator->(&local_2118);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(&pcVar8->PreContext,pcVar4,"/.../");
            pcVar8 = __gnu_cxx::
                     __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                     ::operator->(&local_2118);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(&pcVar8->PostContext,pcVar4,"/.../");
            __gnu_cxx::
            __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
            ::operator++(&local_2118);
          }
        }
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_2380);
        bVar2 = cmCTestGenericHandler::StartResultingXML
                          (&this->super_cmCTestGenericHandler,PartBuild,"Build",
                           (cmGeneratedFileStream *)local_2380);
        if (bVar2) {
          cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_2548,(ostream *)local_2380,0);
          GenerateXMLHeader(this,(cmXMLWriter *)local_2548);
          if ((this->UseCTestLaunch & 1U) == 0) {
            GenerateXMLLogScraped(this,(cmXMLWriter *)local_2548);
          }
          else {
            GenerateXMLLaunched(this,(cmXMLWriter *)local_2548);
          }
          GenerateXMLFooter(this,(cmXMLWriter *)local_2548,(double)evit._M_current);
          if (((local_1f50 != 4) || (local_1f4c != 0)) || (0 < this->TotalErrors)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_26c0);
            poVar3 = std::operator<<((ostream *)local_26c0,"Error(s) when building project");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,6,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x21c,pcVar4,false);
            std::__cxx11::string::~string(local_26e0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_26c0);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2858);
          poVar3 = std::operator<<((ostream *)local_2858,"   ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->TotalErrors);
          pcVar4 = "";
          if (this->MaxErrors <= this->TotalErrors) {
            pcVar4 = " or more";
          }
          poVar3 = std::operator<<(poVar3,pcVar4);
          poVar3 = std::operator<<(poVar3," Compiler errors");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x222,pcVar4,false);
          std::__cxx11::string::~string(local_2878);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2858);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_29f0);
          poVar3 = std::operator<<((ostream *)local_29f0,"   ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->TotalWarnings);
          pcVar4 = "";
          if (this->MaxWarnings <= this->TotalWarnings) {
            pcVar4 = " or more";
          }
          poVar3 = std::operator<<(poVar3,pcVar4);
          poVar3 = std::operator<<(poVar3," Compiler warnings");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x225,pcVar4,false);
          std::__cxx11::string::~string(local_2a10);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_29f0);
          this_local._4_4_ = local_1f4c;
          buildDirectory._4_4_ = 1;
          cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_2548);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_24f8);
          poVar3 = std::operator<<((ostream *)local_24f8,"Cannot create build XML file");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x20a,pcVar4,false);
          std::__cxx11::string::~string((string *)&xml.ElementOpen);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_24f8);
          this_local._4_4_ = -1;
          buildDirectory._4_4_ = 1;
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2380);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&elapsed_time_start);
        std::__cxx11::string::~string((string *)&local_808);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c0);
        poVar3 = std::operator<<((ostream *)local_7c0,
                                 "Cannot find BuildDirectory  key in the DartConfiguration.tcl");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x16a,pcVar4,false);
        std::__cxx11::string::~string((string *)&useLaunchers);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c0);
        this_local._4_4_ = -1;
        buildDirectory._4_4_ = 1;
      }
      std::__cxx11::string::~string((string *)&local_620);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5d0);
      poVar3 = std::operator<<((ostream *)local_5d0,
                               "Cannot find MakeCommand key in the DartConfiguration.tcl");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x160,pcVar4,false);
      std::__cxx11::string::~string(local_5f0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5d0);
      this_local._4_4_ = -1;
      buildDirectory._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_458);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int cmCTestBuildHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "Build project" << std::endl,
    this->Quiet);

  // do we have time for this
  if (this->CTest->GetRemainingTimeAllowed() < 120)
    {
    return 0;
    }

  int entry;
  for ( entry = 0;
    cmCTestWarningErrorFileLine[entry].RegularExpressionString;
    ++ entry )
    {
    cmCTestBuildHandler::cmCTestCompileErrorWarningRex r;
    if ( r.RegularExpression.compile(
        cmCTestWarningErrorFileLine[entry].RegularExpressionString) )
      {
      r.FileIndex = cmCTestWarningErrorFileLine[entry].FileIndex;
      r.LineIndex = cmCTestWarningErrorFileLine[entry].LineIndex;
      this->ErrorWarningFileLineRegex.push_back(r);
      }
    else
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
        "Problem Compiling regular expression: "
       << cmCTestWarningErrorFileLine[entry].RegularExpressionString
       << std::endl);
      }
    }

  // Determine build command and build directory
  std::string makeCommand = this->GetMakeCommand();
  if (makeCommand.empty())
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
      "Cannot find MakeCommand key in the DartConfiguration.tcl"
      << std::endl);
    return -1;
    }

  const std::string &buildDirectory
    = this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty())
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
      "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
      << std::endl);
    return -1;
    }

  std::string const& useLaunchers =
    this->CTest->GetCTestConfiguration("UseLaunchers");
  this->UseCTestLaunch = cmSystemTools::IsOn(useLaunchers.c_str());

  // Create a last build log
  cmGeneratedFileStream ofs;
  double elapsed_time_start = cmSystemTools::GetTime();
  if ( !this->StartLogFile("Build", ofs) )
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot create build log file"
      << std::endl);
    }

  // Create lists of regular expression strings for errors, error exceptions,
  // warnings and warning exceptions.
  std::vector<std::string>::size_type cc;
  for ( cc = 0; cmCTestErrorMatches[cc]; cc ++ )
    {
    this->CustomErrorMatches.push_back(cmCTestErrorMatches[cc]);
    }
  for ( cc = 0; cmCTestErrorExceptions[cc]; cc ++ )
    {
    this->CustomErrorExceptions.push_back(cmCTestErrorExceptions[cc]);
    }
  for ( cc = 0; cmCTestWarningMatches[cc]; cc ++ )
    {
    this->CustomWarningMatches.push_back(cmCTestWarningMatches[cc]);
    }

  for ( cc = 0; cmCTestWarningExceptions[cc]; cc ++ )
    {
    this->CustomWarningExceptions.push_back(cmCTestWarningExceptions[cc]);
    }

  // Pre-compile regular expressions objects for all regular expressions
  std::vector<std::string>::iterator it;

#define cmCTestBuildHandlerPopulateRegexVector(strings, regexes) \
  regexes.clear(); \
    cmCTestOptionalLog(this->CTest, DEBUG, this << "Add " #regexes \
    << std::endl, this->Quiet); \
  for ( it = strings.begin(); it != strings.end(); ++it ) \
    { \
    cmCTestOptionalLog(this->CTest, DEBUG, "Add " #strings ": " \
    << *it << std::endl, this->Quiet); \
    regexes.push_back(it->c_str()); \
    }
  cmCTestBuildHandlerPopulateRegexVector(
    this->CustomErrorMatches, this->ErrorMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(
    this->CustomErrorExceptions, this->ErrorExceptionRegex);
  cmCTestBuildHandlerPopulateRegexVector(
    this->CustomWarningMatches, this->WarningMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(
    this->CustomWarningExceptions, this->WarningExceptionRegex);


  // Determine source and binary tree substitutions to simplify the output.
  this->SimplifySourceDir = "";
  this->SimplifyBuildDir = "";
  if ( this->CTest->GetCTestConfiguration("SourceDirectory").size() > 20 )
    {
    std::string srcdir
      = this->CTest->GetCTestConfiguration("SourceDirectory") + "/";
    std::string srcdirrep;
    for ( cc = srcdir.size()-2; cc > 0; cc -- )
      {
      if ( srcdir[cc] == '/' )
        {
        srcdirrep = srcdir.c_str() + cc;
        srcdirrep = "/..." + srcdirrep;
        srcdir = srcdir.substr(0, cc+1);
        break;
        }
      }
    this->SimplifySourceDir = srcdir;
    }
  if ( this->CTest->GetCTestConfiguration("BuildDirectory").size() > 20 )
    {
    std::string bindir
      = this->CTest->GetCTestConfiguration("BuildDirectory") + "/";
    std::string bindirrep;
    for ( cc = bindir.size()-2; cc > 0; cc -- )
      {
      if ( bindir[cc] == '/' )
        {
        bindirrep = bindir.c_str() + cc;
        bindirrep = "/..." + bindirrep;
        bindir = bindir.substr(0, cc+1);
        break;
        }
      }
    this->SimplifyBuildDir = bindir;
    }


  // Ok, let's do the build

  // Remember start build time
  this->StartBuild = this->CTest->CurrentTime();
  this->StartBuildTime = cmSystemTools::GetTime();
  int retVal = 0;
  int res = cmsysProcess_State_Exited;
  if ( !this->CTest->GetShowOnly() )
    {
    res = this->RunMakeCommand(makeCommand.c_str(), &retVal,
      buildDirectory.c_str(), 0, ofs);
    }
  else
    {
    cmCTestOptionalLog(this->CTest, DEBUG, "Build with command: " <<
      makeCommand << std::endl, this->Quiet);
    }

  // Remember end build time and calculate elapsed time
  this->EndBuild = this->CTest->CurrentTime();
  this->EndBuildTime = cmSystemTools::GetTime();
  double elapsed_build_time = cmSystemTools::GetTime() - elapsed_time_start;

  // Cleanups strings in the errors and warnings list.
  t_ErrorsAndWarningsVector::iterator evit;
  if ( !this->SimplifySourceDir.empty() )
    {
    for ( evit = this->ErrorsAndWarnings.begin();
      evit != this->ErrorsAndWarnings.end();
      ++ evit )
      {
      cmSystemTools::ReplaceString(
        evit->Text, this->SimplifySourceDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(
        evit->PreContext, this->SimplifySourceDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(
        evit->PostContext, this->SimplifySourceDir.c_str(), "/.../");
      }
    }

  if ( !this->SimplifyBuildDir.empty() )
    {
    for ( evit = this->ErrorsAndWarnings.begin();
      evit != this->ErrorsAndWarnings.end();
      ++ evit )
      {
      cmSystemTools::ReplaceString(
        evit->Text, this->SimplifyBuildDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(
        evit->PreContext, this->SimplifyBuildDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(
        evit->PostContext, this->SimplifyBuildDir.c_str(), "/.../");
      }
    }

  // Generate XML output
  cmGeneratedFileStream xofs;
  if(!this->StartResultingXML(cmCTest::PartBuild, "Build", xofs))
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot create build XML file"
      << std::endl);
    return -1;
    }
  cmXMLWriter xml(xofs);
  this->GenerateXMLHeader(xml);
  if(this->UseCTestLaunch)
    {
    this->GenerateXMLLaunched(xml);
    }
  else
    {
    this->GenerateXMLLogScraped(xml);
    }
  this->GenerateXMLFooter(xml, elapsed_build_time);

  if (res != cmsysProcess_State_Exited || retVal || this->TotalErrors > 0)
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Error(s) when building project"
      << std::endl);
    }

  // Display message about number of errors and warnings
  cmCTestLog(this->CTest, HANDLER_OUTPUT, "   " << this->TotalErrors
    << (this->TotalErrors >= this->MaxErrors ? " or more" : "")
    << " Compiler errors" << std::endl);
  cmCTestLog(this->CTest, HANDLER_OUTPUT, "   " << this->TotalWarnings
    << (this->TotalWarnings >= this->MaxWarnings ? " or more" : "")
    << " Compiler warnings" << std::endl);

  return retVal;
}